

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

BignumCarry
mp_add_masked_into(BignumInt *w_out,size_t rw,mp_int *a,mp_int *b,BignumInt b_and,BignumInt b_xor,
                  BignumCarry carry)

{
  BignumInt BVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  BignumInt BVar4;
  ulong uVar5;
  
  for (uVar3 = 0; rw != uVar3; uVar3 = uVar3 + 1) {
    if (uVar3 < a->nw) {
      BVar4 = a->w[uVar3];
    }
    else {
      BVar4 = 0;
    }
    if (uVar3 < b->nw) {
      BVar1 = b->w[uVar3];
    }
    else {
      BVar1 = 0;
    }
    uVar2 = BVar1 & b_and ^ b_xor;
    uVar5 = BVar4 + carry;
    carry = (ulong)CARRY8(BVar4,carry) + (ulong)CARRY8(uVar5,uVar2);
    if (w_out != (BignumInt *)0x0) {
      w_out[uVar3] = uVar5 + uVar2;
    }
  }
  return carry;
}

Assistant:

static BignumCarry mp_add_masked_into(
    BignumInt *w_out, size_t rw, mp_int *a, mp_int *b,
    BignumInt b_and, BignumInt b_xor, BignumCarry carry)
{
    for (size_t i = 0; i < rw; i++) {
        BignumInt aword = mp_word(a, i), bword = mp_word(b, i), out;
        bword = (bword & b_and) ^ b_xor;
        BignumADC(out, carry, aword, bword, carry);
        if (w_out)
            w_out[i] = out;
    }
    return carry;
}